

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::
reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<(anonymous_namespace)::Enum1> *this,exception_ptr *error)

{
  QPromise<(anonymous_namespace)::Enum1> *pQVar1;
  Data *pDVar2;
  PromiseData<(anonymous_namespace)::Enum1> *pPVar3;
  QPromise<(anonymous_namespace)::Enum1> *promise;
  exception_ptr *error_local;
  PromiseResolver<(anonymous_namespace)::Enum1> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
           ::operator->(&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<(anonymous_namespace)::Enum1> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<(anonymous_namespace)::Enum1>_>
             ::operator->(&(pQVar1->super_QPromiseBase<(anonymous_namespace)::Enum1>).m_d);
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    reject<std::__exception_ptr::exception_ptr>
              (&pPVar3->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               ,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<(anonymous_namespace)::Enum1>_>
             ::operator->(&(pQVar1->super_QPromiseBase<(anonymous_namespace)::Enum1>).m_d);
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch(&pPVar3->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
            );
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }